

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvwriter.cc
# Opt level: O0

int32 __thiscall mkvmuxer::MkvWriter::Write(MkvWriter *this,void *buffer,uint32 length)

{
  size_t sVar1;
  size_t bytes_written;
  uint32 length_local;
  void *buffer_local;
  MkvWriter *this_local;
  
  if (this->file_ == (FILE *)0x0) {
    this_local._4_4_ = -1;
  }
  else if (length == 0) {
    this_local._4_4_ = 0;
  }
  else if (buffer == (void *)0x0) {
    this_local._4_4_ = -1;
  }
  else {
    sVar1 = fwrite(buffer,1,(ulong)length,(FILE *)this->file_);
    this_local._4_4_ = -1;
    if (sVar1 == length) {
      this_local._4_4_ = 0;
    }
  }
  return this_local._4_4_;
}

Assistant:

int32 MkvWriter::Write(const void* buffer, uint32 length) {
  if (!file_)
    return -1;

  if (length == 0)
    return 0;

  if (buffer == NULL)
    return -1;

  const size_t bytes_written = fwrite(buffer, 1, length, file_);

  return (bytes_written == length) ? 0 : -1;
}